

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_call_finalizer(global_State *g,lua_State *L,cTValue *mo,GCobj *o)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  ptrdiff_t pVar7;
  lua_State *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  ptrdiff_t argbase;
  ptrdiff_t errobj;
  TValue *top;
  int errcode;
  GCSize oldt;
  uint8_t oldh;
  undefined8 *argbase_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined3 in_stack_ffffffffffffff2c;
  VMEvent ev;
  global_State *in_stack_ffffffffffffff50;
  
  bVar1 = *(byte *)(in_RDI + 0x109);
  ev = CONCAT13(bVar1,in_stack_ffffffffffffff2c) & 0xf0ffffff;
  uVar2 = *(undefined4 *)(in_RDI + 0x54);
  *(uint *)(in_RDI + 0x31c) = *(uint *)(in_RDI + 0x31c) & 0xffffffef;
  *(byte *)(in_RDI + 0x109) = *(byte *)(in_RDI + 0x109) & 0x7f | 0x50;
  if ((bVar1 & 0x80) != 0) {
    lj_dispatch_update(in_stack_ffffffffffffff50);
  }
  *(undefined4 *)(in_RDI + 0x54) = 0x7fffff00;
  puVar4 = *(undefined8 **)(in_RSI + 0x18);
  argbase_00 = puVar4 + 1;
  *puVar4 = *in_RDX;
  bVar1 = in_RCX->gct;
  *(int *)argbase_00 = (int)in_RCX;
  *(uint *)((long)puVar4 + 0xc) = bVar1 ^ 0xffffffff;
  *(undefined8 **)(in_RSI + 0x18) = puVar4 + 2;
  iVar6 = lj_vm_pcall(in_RSI,argbase_00,1,0xffffffffffffffff);
  *(byte *)(in_RDI + 0x109) = *(byte *)(in_RDI + 0x109) & 0xf | (byte)((uint)ev >> 0x18);
  if ((ev & 0x80000000) != LJ_VMEVENT_BC_) {
    lj_dispatch_update(in_stack_ffffffffffffff50);
  }
  *(undefined4 *)(in_RDI + 0x54) = uVar2;
  if (iVar6 != 0) {
    lVar5 = *(long *)(in_RSI + 0x18);
    uVar3 = *(uint *)(in_RSI + 0x24);
    if (((*(byte *)((ulong)*(uint *)(in_RSI + 8) + 0x10b) & 0x10) != 0) &&
       (pVar7 = lj_vmevent_prepare(in_RCX,ev), pVar7 != 0)) {
      puVar4 = *(undefined8 **)(in_RSI + 0x18);
      *(undefined8 **)(in_RSI + 0x18) = puVar4 + 1;
      *puVar4 = *(undefined8 *)((ulong)*(uint *)(in_RSI + 0x24) + ((lVar5 + -8) - (ulong)uVar3));
      lj_vmevent_call((lua_State *)CONCAT44(iVar6,in_stack_ffffffffffffff20),(ptrdiff_t)argbase_00);
    }
    *(long *)(in_RSI + 0x18) = *(long *)(in_RSI + 0x18) + -8;
  }
  return;
}

Assistant:

static void gc_call_finalizer(global_State *g, lua_State *L,
			      cTValue *mo, GCobj *o)
{
  /* Save and restore lots of state around the __gc callback. */
  uint8_t oldh = hook_save(g);
  GCSize oldt = g->gc.threshold;
  int errcode;
  TValue *top;
  lj_trace_abort(g);
  hook_entergc(g);  /* Disable hooks and new traces during __gc. */
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = LJ_MAX_MEM;  /* Prevent GC steps. */
  top = L->top;
  copyTV(L, top++, mo);
  if (LJ_FR2) setnilV(top++);
  setgcV(L, top, o, ~o->gch.gct);
  L->top = top+1;
  errcode = lj_vm_pcall(L, top, 1+0, -1);  /* Stack: |mo|o| -> | */
  hook_restore(g, oldh);
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = oldt;  /* Restore GC threshold. */
  if (errcode) {
    ptrdiff_t errobj = savestack(L, L->top-1);  /* Stack may be resized. */
    lj_vmevent_send(L, ERRFIN,
      copyTV(L, L->top++, restorestack(L, errobj));
    );
    L->top--;
  }
}